

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

RGB __thiscall pbrt::MIPMap::Filter<pbrt::RGB>(MIPMap *this,Point2f st,Vector2f dst0,Vector2f dst1)

{
  FilterFunction FVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  uint uVar6;
  Point2i PVar7;
  undefined4 extraout_var;
  Tuple2<pbrt::Point2,_int> st_00;
  int level;
  uint level_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float x;
  Float FVar10;
  ulong in_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar15 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar23 [12];
  undefined1 auVar22 [16];
  undefined1 in_ZMM4 [64];
  Tuple2<pbrt::Vector2,_float> dst1_00;
  undefined1 in_register_00001384 [12];
  RGB RVar24;
  RGB RVar25;
  RGB RVar26;
  initializer_list<float> __l;
  int vb;
  Float FStack_64;
  Float local_60;
  undefined1 local_58 [16];
  Float va;
  Float FStack_40;
  undefined1 auStack_44 [12];
  undefined8 local_38;
  undefined1 local_28 [16];
  
  auVar23 = in_ZMM4._4_12_;
  auVar19._8_56_ = in_register_00001288;
  auVar19._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar17._8_56_ = in_register_00001248;
  auVar17._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar11 = auVar17._0_16_;
  local_58 = auVar19._0_16_;
  if ((this->options).filter == EWA) {
    auVar8._0_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.x *
                   dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar8._4_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.y *
                   dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar8._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
    auVar8._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
    auVar9._0_4_ = dst1.super_Tuple2<pbrt::Vector2,_float>.x *
                   dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar9._4_4_ = dst1.super_Tuple2<pbrt::Vector2,_float>.y *
                   dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar9._8_4_ = in_register_00001288._0_4_ * in_register_00001288._0_4_;
    auVar9._12_4_ = in_register_00001288._4_4_ * in_register_00001288._4_4_;
    auVar8 = vhaddps_avx(auVar8,auVar8);
    auVar9 = vhaddps_avx(auVar9,auVar9);
    auVar16 = auVar11;
    if (auVar9._0_4_ <= auVar8._0_4_) {
      auVar16 = local_58;
      local_58 = auVar11;
    }
    dst1_00 = auVar16._0_8_;
    auVar11 = vinsertps_avx(auVar16,local_58,0x1c);
    auVar8 = vinsertps_avx(local_58,auVar16,0x4c);
    auVar12._0_4_ = auVar11._0_4_ * auVar11._0_4_ + auVar8._0_4_ * auVar8._0_4_;
    auVar12._4_4_ = auVar11._4_4_ * auVar11._4_4_ + auVar8._4_4_ * auVar8._4_4_;
    auVar12._8_4_ = auVar11._8_4_ * auVar11._8_4_ + auVar8._8_4_ * auVar8._8_4_;
    auVar12._12_4_ = auVar11._12_4_ * auVar11._12_4_ + auVar8._12_4_ * auVar8._12_4_;
    auVar8 = vsqrtps_avx(auVar12);
    x = auVar8._0_4_;
    fVar21 = x * (this->options).maxAnisotropy;
    auVar11 = vinsertps_avx(auVar8,ZEXT416((uint)fVar21),0x1d);
    uVar2 = vcmpps_avx512vl(auVar11,auVar8,1);
    if ((~(ushort)uVar2 & 3) == 0) {
      auVar11 = vmovshdup_avx(auVar8);
      fVar21 = auVar11._0_4_ / fVar21;
      x = x * fVar21;
      dst1_00.x = auVar16._0_4_ * fVar21;
      dst1_00.y = auVar16._4_4_ * fVar21;
    }
    if ((x == 0.0) && (!NAN(x))) {
      RVar24 = Bilerp<pbrt::RGB>(this,0,st);
      return RVar24;
    }
    sVar5 = (this->pyramid).nStored;
    FVar10 = Log2(x);
    auVar8 = vmaxss_avx(ZEXT416((uint)(FVar10 + (float)((int)sVar5 + -1))),ZEXT416(0));
    auVar11 = vroundss_avx(auVar8,auVar8,9);
    level = (int)auVar11._0_4_;
    auVar16._0_4_ = (int)auVar11._0_4_;
    auVar16._4_4_ = (int)auVar11._4_4_;
    auVar16._8_4_ = (int)auVar11._8_4_;
    auVar16._12_4_ = (int)auVar11._12_4_;
    auVar11 = vcvtdq2ps_avx(auVar16);
    fVar21 = auVar8._0_4_ - auVar11._0_4_;
    local_28 = ZEXT416((uint)fVar21);
    fVar21 = 1.0 - fVar21;
    RVar25 = EWA<pbrt::RGB>(this,level,st,(Vector2f)local_58._0_8_,(Vector2f)dst1_00);
    local_38 = RVar25._0_8_;
    RVar26 = EWA<pbrt::RGB>(this,level + 1,st,(Vector2f)local_58._0_8_,(Vector2f)dst1_00);
    RVar24.g = RVar26.g * (float)local_28._0_4_ + fVar21 * local_38._4_4_;
    RVar24.r = RVar26.r * (float)local_28._0_4_ + fVar21 * (float)local_38;
    RVar24.b = RVar26.b * (float)local_28._0_4_ + RVar25.b * fVar21;
    return RVar24;
  }
  auVar11 = vmovlhps_avx(auVar11,local_58);
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  _va = vandps_avx512vl(auVar11,auVar3);
  __l._M_len = 4;
  __l._M_array = &va;
  fVar21 = std::max<float>(__l);
  sVar5 = (this->pyramid).nStored;
  auVar11 = vmaxss_avx(SUB6416(ZEXT464(0x322bcc77),0),ZEXT416((uint)(fVar21 + fVar21)));
  FVar10 = Log2(auVar11._0_4_);
  fVar21 = FVar10 + (float)((int)sVar5 + -1);
  level_00 = (int)(this->pyramid).nStored - 1;
  if ((float)(int)level_00 <= fVar21) {
    st_00.x = 0;
    st_00.y = 0;
LAB_003817bd:
    RVar24 = Texel<pbrt::RGB>(this,level_00,(Point2i)st_00);
  }
  else {
    auVar11 = vroundss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21),9);
    uVar6 = (uint)auVar11._0_4_;
    level_00 = ~((int)uVar6 >> 0x1f) & uVar6;
    FVar1 = (this->options).filter;
    if (FVar1 == Trilinear) {
      auVar15 = ZEXT856(in_XMM0_Qb);
      if (0 < (int)uVar6) {
        vb = 1;
        fVar21 = fVar21 - (float)(int)level_00;
        va = fVar21;
        if (fVar21 <= 1.0) {
          RVar24 = Bilerp<pbrt::RGB>(this,level_00,st);
          auVar13._0_8_ = RVar24._0_8_;
          auVar13._8_56_ = auVar15;
          uVar2 = vmovlps_avx(auVar13._0_16_);
          auVar15 = ZEXT856(in_XMM0_Qb);
          FStack_40 = RVar24.b;
          _va = uVar2;
          RVar24 = Bilerp<pbrt::RGB>(this,level_00 + 1,st);
          local_60 = RVar24.b;
          auVar14._0_8_ = RVar24._0_8_;
          auVar14._8_56_ = auVar15;
          _vb = vmovlps_avx(auVar14._0_16_);
          RVar24 = Lerp(fVar21,(RGB *)&va,(RGB *)&vb);
          return RVar24;
        }
        LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                   ,0xfe,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [6])0x3cfdb2,
                   (char (*) [2])0x2c93214,(char (*) [6])0x3cfdb2,&va,(char (*) [2])0x2c93214,&vb);
      }
      level_00 = 0;
    }
    else if (FVar1 != Bilinear) {
      if (FVar1 != Point) {
        LogFatal<char_const(&)[44]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                   ,0xf9,"Check failed: %s",
                   (char (*) [44])"options.filter == FilterFunction::Trilinear");
      }
      PVar7 = LevelResolution(this,level_00);
      auVar4._8_8_ = in_XMM0_Qb;
      auVar4._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
      auVar20._8_4_ = 0x3effffff;
      auVar20._0_8_ = 0x3effffff3effffff;
      auVar20._12_4_ = 0x3effffff;
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      auVar11._0_4_ = (float)PVar7.super_Tuple2<pbrt::Point2,_int>.x;
      auVar11._4_12_ = auVar23;
      auVar11 = vfmadd213ss_fma(auVar11,auVar4,SUB6416(ZEXT464(0xbf000000),0));
      auVar8 = vpternlogd_avx512vl(auVar20,auVar11,auVar18,0xf8);
      auVar11 = ZEXT416((uint)(auVar11._0_4_ + auVar8._0_4_));
      auVar8 = vroundss_avx(auVar11,auVar11,0xb);
      auVar11 = vmovshdup_avx(auVar4);
      auVar22._0_4_ = (float)PVar7.super_Tuple2<pbrt::Point2,_int>.y;
      auVar22._4_12_ = in_register_00001384;
      auVar11 = vfmadd213ss_fma(auVar22,auVar11,SUB6416(ZEXT464(0xbf000000),0));
      auVar9 = vpternlogd_avx512vl(auVar20,auVar11,auVar18,0xf8);
      auVar11 = ZEXT416((uint)(auVar11._0_4_ + auVar9._0_4_));
      auVar11 = vroundss_avx(auVar11,auVar11,0xb);
      st_00 = (Tuple2<pbrt::Point2,_int>)
              (CONCAT44(extraout_var,(int)auVar8._0_4_) | (ulong)(uint)(int)auVar11._0_4_ << 0x20);
      goto LAB_003817bd;
    }
    RVar24 = Bilerp<pbrt::RGB>(this,level_00,st);
  }
  return RVar24;
}

Assistant:

T MIPMap::Filter(Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        // Handle non-EWA MIP Map filter
        Float width = 2 * std::max({std::abs(dst0[0]), std::abs(dst0[1]),
                                    std::abs(dst1[0]), std::abs(dst1[1])});
        // Compute MIP Map level for _width_ and handle very wide filter
        int nLevels = Levels();
        Float level = nLevels - 1 + Log2(std::max<Float>(width, 1e-8));
        if (level >= Levels() - 1)
            return Texel<T>(Levels() - 1, {0, 0});
        int iLevel = std::max(0, int(std::floor(level)));

        if (options.filter == FilterFunction::Point) {
            // Return point-sampled value at selected MIP level
            Point2i resolution = LevelResolution(iLevel);
            Point2i sti(std::round(st[0] * resolution[0] - 0.5f),
                        std::round(st[1] * resolution[1] - 0.5f));
            return Texel<T>(iLevel, sti);

        } else if (options.filter == FilterFunction::Bilinear) {
            // Return bilinear-filtered value at selected MIP level
            return Bilerp<T>(iLevel, st);

        } else {
            // Return trilinear-filtered value at selected MIP level
            CHECK(options.filter == FilterFunction::Trilinear);
            if (iLevel == 0)
                return Bilerp<T>(0, st);
            else {
                Float delta = level - iLevel;
                CHECK_LE(delta, 1);
                return Lerp(delta, Bilerp<T>(iLevel, st), Bilerp<T>(iLevel + 1, st));
            }
        }
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0), minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}